

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

bool EthBasePort::CheckDebugHeader(ostream *debugStream,string *caller,char *header,uint version)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char local_2b;
  char local_2a;
  char local_29;
  
  iVar1 = strncmp(header,"DBG",3);
  if (iVar1 == 0) {
    if (header[3] == 0x30) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (debugStream,(caller->_M_dataplus)._M_p,caller->_M_string_length);
      pcVar4 = ": No debug data available";
      lVar3 = 0x19;
    }
    else {
      if ((int)header[3] - 0x30U == version) {
        return true;
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (debugStream,(caller->_M_dataplus)._M_p,caller->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": Unsupported debug level: ",0x1b);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (must be ",10);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      pcVar4 = ")";
      lVar3 = 1;
    }
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (debugStream,(caller->_M_dataplus)._M_p,caller->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": Unexpected header string: ",0x1c);
    local_2b = *header;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2b,1);
    local_2a = header[1];
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a,1);
    local_29 = header[2];
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
    pcVar4 = " (should be DBG)";
    lVar3 = 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool EthBasePort::CheckDebugHeader(std::ostream &debugStream, const std::string &caller, const char *header,
                                   unsigned int version)
{
    if (strncmp(header, "DBG", 3) != 0) {
        debugStream << caller << ": Unexpected header string: " << header[0] << header[1]
                    << header[2] << " (should be DBG)" << std::endl;
        return false;
    }
    unsigned int debugLevel = header[3] - '0';
    if (debugLevel == 0) {
        debugStream << caller << ": No debug data available" << std::endl;
        return false;
    }
    // Introduced debugLevel 2 with Firmware V8. Use an older version of this software for
    // earlier versions of firmware.
    else if (debugLevel != version) {
        debugStream << caller << ": Unsupported debug level: " << debugLevel << " (must be "
                    << version << ")" << std::endl;
        return false;
    }
    return true;
}